

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
logloss::getUpdate(logloss *this,float prediction,float label,float update_scale,
                  float pred_per_update)

{
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  logloss *unaff_retaddr;
  float d;
  float x;
  float w;
  float in_stack_fffffffffffffffc;
  
  dVar2 = std::exp((double)(ulong)(uint)(in_XMM1_Da * in_XMM0_Da));
  if (1e-06 <= in_XMM2_Da * in_XMM3_Da) {
    fVar1 = wexpmx(unaff_retaddr,in_stack_fffffffffffffffc);
    fVar1 = -(in_XMM1_Da * fVar1 + in_XMM0_Da) / in_XMM3_Da;
  }
  else {
    fVar1 = (in_XMM1_Da * in_XMM2_Da) / (SUB84(dVar2,0) + 1.0);
  }
  return fVar1;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float w, x;
    float d = correctedExp(label * prediction);
    if (update_scale * pred_per_update < 1e-6)
    {
      /* As with squared loss, for small eta_t we replace the update
       * with its first order Taylor expansion to avoid numerical problems
       */
      return label * update_scale / (1 + d);
    }
    x = update_scale * pred_per_update + label * prediction + d;
    w = wexpmx(x);
    return -(label * w + prediction) / pred_per_update;
  }